

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
::unscaleLP(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            *this)

{
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *pSVar1;
  undefined8 in_RAX;
  SPxOut *pSVar2;
  Verbosity old_verbosity;
  undefined8 local_18;
  
  pSVar2 = this->spxout;
  local_18 = in_RAX;
  if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
    local_18 = CONCAT44(pSVar2->m_verbosity,5);
    (*pSVar2->_vptr_SPxOut[2])();
    pSVar2 = soplex::operator<<(this->spxout,"remove persistent scaling of LP");
    std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,(long)&local_18 + 4);
  }
  pSVar1 = this->lp_scaler;
  if (pSVar1 == (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)0x0) {
    pSVar2 = this->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
      local_18 = CONCAT44(pSVar2->m_verbosity,5);
      (*pSVar2->_vptr_SPxOut[2])();
      pSVar2 = soplex::operator<<(this->spxout,"no LP scaler available");
      std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,(long)&local_18 + 4);
    }
  }
  else {
    (**(code **)(*(long *)pSVar1 + 0x70))(pSVar1,this);
  }
  return;
}

Assistant:

void SPxLPBase<R>::unscaleLP()
{
   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "remove persistent scaling of LP" << std::endl;)

   if(lp_scaler)
   {
      lp_scaler->unscale(*this);
   }
   else
   {
      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "no LP scaler available" << std::endl;)
   }
}